

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

void __thiscall
QSslCertificate::QSslCertificate(QSslCertificate *this,QByteArray *data,EncodingFormat format)

{
  bool bVar1;
  QMessageLogger *this_00;
  QTlsBackend *pQVar2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *this_01;
  int in_EDX;
  undefined8 in_RSI;
  QSslCertificatePrivate *in_RDI;
  long in_FS_OFFSET;
  _func_QList<QSslCertificate>_QByteArray_ptr_int *X509Reader;
  QTlsBackend *tlsBackend;
  QList<QSslCertificate> certs;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  QExplicitlySharedDataPointer<QSslCertificatePrivate> *in_stack_ffffffffffffff70;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMessageLogger *)operator_new(0x10);
  QSslCertificatePrivate::QSslCertificatePrivate(in_RDI);
  QExplicitlySharedDataPointer<QSslCertificatePrivate>::QExplicitlySharedDataPointer
            (in_stack_ffffffffffffff70,(QSslCertificatePrivate *)in_stack_ffffffffffffff68);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x26cbe4);
  if ((!bVar1) && (pQVar2 = QTlsBackend::activeOrAnyBackend(), pQVar2 != (QTlsBackend *)0x0)) {
    if (in_EDX == 0) {
      this_01 = (QLoggingCategoryMacroHolder<(QtMsgType)1> *)(**(code **)(*(long *)pQVar2 + 0xe8))()
      ;
    }
    else {
      this_01 = (QLoggingCategoryMacroHolder<(QtMsgType)1> *)(**(code **)(*(long *)pQVar2 + 0xf0))()
      ;
    }
    if (this_01 == (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x0) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(this_01,in_stack_ffffffffffffff68);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x26cc9e);
        QMessageLogger::QMessageLogger
                  (this_00,(char *)in_RDI,(int)((ulong)this_01 >> 0x20),
                   (char *)in_stack_ffffffffffffff68,(char *)0x26ccb4);
        QMessageLogger::warning(local_38,"Current TLS plugin does not support reading from PEM/DER")
        ;
        local_10 = local_10 & 0xffffffffffffff00;
      }
    }
    else {
      local_50 = 0xaaaaaaaaaaaaaaaa;
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      (*(code *)this_01)(&local_50,in_RSI,1);
      bVar1 = QList<QSslCertificate>::isEmpty((QList<QSslCertificate> *)0x26cd17);
      if (!bVar1) {
        QList<QSslCertificate>::first((QList<QSslCertificate> *)this_01);
        QExplicitlySharedDataPointer<QSslCertificatePrivate>::operator=
                  ((QExplicitlySharedDataPointer<QSslCertificatePrivate> *)this_01,
                   (QExplicitlySharedDataPointer<QSslCertificatePrivate> *)in_stack_ffffffffffffff68
                  );
      }
      QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x26cd3c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSslCertificate::QSslCertificate(const QByteArray &data, QSsl::EncodingFormat format)
    : d(new QSslCertificatePrivate)
{
    if (data.isEmpty())
        return;

    const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (!tlsBackend)
        return;

    auto *X509Reader = format == QSsl::Pem ? tlsBackend->X509PemReader() : tlsBackend->X509DerReader();
    if (!X509Reader) {
        qCWarning(lcSsl, "Current TLS plugin does not support reading from PEM/DER");
        return;
    }

    const QList<QSslCertificate> certs = X509Reader(data, 1);
    if (!certs.isEmpty())
        d = certs.first().d;
}